

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

Gia_Man_t * Abc_NtkHieCecTest2(char *pFileName,char *pModelName,int fVerbose)

{
  int iVar1;
  Au_Ntk_t *p;
  Au_Ntk_t *pAVar2;
  Gia_Man_t *pGVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  Au_Ntk_t *pNtk;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p = Au_NtkParseCBlif(pFileName);
  if (p == (Au_Ntk_t *)0x0) {
    puts("Reading CBLIF file has failed.");
  }
  else {
    if ((p->pMan != (Au_Man_t *)0x0) && ((p->pMan->vNtks).pArray != (void **)0x0)) {
      iVar6 = 3;
      iVar1 = clock_gettime(3,&local_40);
      if (iVar1 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Abc_Print(iVar6,"%s =","Reading file");
      Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar8 - lVar4) / 1000000.0);
      if (fVerbose != 0) {
        Au_ManPrintBoxInfo(p);
        Au_ManPrintStats(p->pMan);
      }
      Au_ManCountThings(p->pMan);
      if (pModelName == (char *)0x0) {
        pAVar2 = (Au_Ntk_t *)0x0;
      }
      else {
        pAVar2 = Au_ManFindNtkP(p->pMan,pModelName);
      }
      pNtk = p;
      if (pAVar2 != (Au_Ntk_t *)0x0) {
        pNtk = pAVar2;
      }
      Au_NtkCheckRecursive(pNtk);
      iVar1 = clock_gettime(3,&local_40);
      if (iVar1 < 0) {
        lVar8 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
        lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
      }
      pGVar3 = Au_NtkDeriveFlatGia(pNtk);
      iVar6 = 3;
      iVar1 = clock_gettime(3,&local_40);
      lVar7 = -1;
      lVar5 = -1;
      if (-1 < iVar1) {
        lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Abc_Print(iVar6,"%s =","Time GIA ");
      Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar5 + lVar8) / 1000000.0);
      Au_ManDelete(p->pMan);
      iVar6 = 3;
      iVar1 = clock_gettime(3,&local_40);
      if (-1 < iVar1) {
        lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Abc_Print(iVar6,"%s =","Time all ");
      Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar7 - lVar4) / 1000000.0);
      return pGVar3;
    }
    puts("There is no hierarchy information.");
    Au_NtkFree(p);
  }
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Abc_NtkHieCecTest2( char * pFileName, char * pModelName, int fVerbose )
{
    int fSimulation = 0;
    Gia_Man_t * pGia = NULL;
    Au_Ntk_t * pNtk, * pNtkClp = NULL;
    abctime clk1 = 0, clk = Abc_Clock();

    // read hierarchical netlist
    pNtk = Au_NtkParseCBlif( pFileName );
    if ( pNtk == NULL )
    {
        printf( "Reading CBLIF file has failed.\n" );
        return NULL;
    }
    if ( pNtk->pMan == NULL || pNtk->pMan->vNtks.pArray == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        Au_NtkFree( pNtk );
        return NULL;
    }
    Abc_PrintTime( 1, "Reading file", Abc_Clock() - clk );

    if ( fVerbose )
    {
        Au_ManPrintBoxInfo( pNtk );
//    Au_ManPrintBoxInfoSorted( pNtk );
        Au_ManPrintStats( pNtk->pMan );
    }
    Au_ManCountThings( pNtk->pMan );

    // select network
    if ( pModelName )
        pNtkClp = Au_ManFindNtkP( pNtk->pMan, pModelName );
    if ( pNtkClp == NULL )
        pNtkClp = pNtk;

    // check if the model is recursive
    Au_NtkCheckRecursive( pNtkClp );

    // collapse
    clk1 = Abc_Clock();
    if ( fSimulation )
    {
        Au_NtkTerSimulate( pNtkClp );
        Abc_PrintTime( 1, "Time sim ", Abc_Clock() - clk1 );
    }
    else
    {
        pGia = Au_NtkDeriveFlatGia( pNtkClp );
        Abc_PrintTime( 1, "Time GIA ", Abc_Clock() - clk1 );
    }

    // delete
    Au_ManDelete( pNtk->pMan );
    Abc_PrintTime( 1, "Time all ", Abc_Clock() - clk );
    return pGia;
}